

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

int __thiscall Arcflow::init(Arcflow *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  runtime_error *prVar2;
  size_t in_RCX;
  void *__buf;
  char local_4b8 [8];
  char _error_msg__2 [256];
  char _error_msg__1 [256];
  Instance local_1f0;
  char local_118 [8];
  char _error_msg_ [256];
  char *fname_local;
  Arcflow *this_local;
  
  _error_msg_._248_8_ = ctx;
  if ((this->ready & 1U) != 0) {
    snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x62);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,local_118);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = check_ext((char *)ctx,".vbp");
  if (bVar1) {
    Instance::Instance(&local_1f0,(char *)_error_msg_._248_8_);
    init(this,(EVP_PKEY_CTX *)&local_1f0);
    Instance::~Instance(&local_1f0);
  }
  else {
    bVar1 = check_ext((char *)_error_msg_._248_8_,".mvp");
    if (bVar1) {
      Instance::Instance((Instance *)(_error_msg__1 + 0xf8),(char *)_error_msg_._248_8_);
      init(this,(EVP_PKEY_CTX *)(_error_msg__1 + 0xf8));
      Instance::~Instance((Instance *)(_error_msg__1 + 0xf8));
    }
    else {
      bVar1 = check_ext((char *)_error_msg_._248_8_,".afg");
      if (!bVar1) {
        snprintf(_error_msg__2 + 0xf8,0x100,"Error: `%s` in \"%s\" line %d","Invalid file extension"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
                 ,0x6a);
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,_error_msg__2 + 0xf8);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      read(this,(int)_error_msg_._248_8_,__buf,in_RCX);
    }
  }
  if ((this->ready & 1U) == 1) {
    return 1;
  }
  snprintf(local_4b8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","ready == true"
           ,
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x6c);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,local_4b8);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::init(const char *fname) {
	throw_assert(ready == false);
	if (check_ext(fname, ".vbp")) {
		init(Instance(fname));
	} else if (check_ext(fname, ".mvp")) {
		init(Instance(fname));
	} else if (check_ext(fname, ".afg")) {
		read(fname);
	} else {
		throw_error("Invalid file extension");
	}
	throw_assert(ready == true);
}